

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

_Bool list_join(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  gravity_class_t *pgVar2;
  gravity_class_t *__src;
  int iVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  uint uVar6;
  char *s;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar7;
  size_t __n;
  uint32_t len;
  ulong uVar8;
  uint32_t alloc;
  ulong new_size;
  gravity_class_t *__src_00;
  long lVar9;
  gravity_value_t v;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t gVar10;
  size_t local_78;
  ulong local_70;
  
  pgVar1 = (args->field_1).p;
  __n = 0;
  if ((nargs < 2) || (args[1].isa != gravity_class_string)) {
    __src_00 = (gravity_class_t *)0x0;
  }
  else {
    __src_00 = (args[1].field_1.p)->objclass;
  }
  uVar6 = *(int *)&pgVar1->objclass << 6;
  local_70 = 0x100;
  if (uVar6 != 0) {
    local_70 = (ulong)uVar6;
  }
  if (__src_00 != (gravity_class_t *)0x0) {
    __n = (size_t)*(uint *)((long)&(args[1].field_1.p)->identifier + 4);
  }
  s = (char *)gravity_calloc(vm,1,local_70);
  if (s == (char *)0x0) {
    local_78._0_1_ = 0;
    gVar10.field_1.n = 0;
    gVar10.isa = gravity_class_null;
    gravity_vm_setslot(vm,gVar10,rindex);
  }
  else {
    pgVar2 = pgVar1->objclass;
    lVar9 = 0;
    uVar8 = 0;
    local_78 = __n;
    do {
      len = (uint32_t)uVar8;
      alloc = (uint32_t)local_70;
      if ((long)pgVar2 <= lVar9) {
        aVar7.p = (gravity_object_t *)gravity_string_new(vm,s,len,alloc);
        value_00.field_1.p = (gravity_object_t *)aVar7.n;
        value_00.isa = (aVar7.p)->isa;
        gravity_vm_setslot(vm,value_00,rindex);
        local_78._0_1_ = 1;
        break;
      }
      v.field_1.n = ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)
                    (*(long *)&pgVar1->has_outer + 8 + lVar9 * 0x10))->n;
      v.isa = *(gravity_class_t **)(*(long *)&pgVar1->has_outer + lVar9 * 0x10);
      gVar10 = convert_value2string(vm,v);
      aVar7 = gVar10.field_1;
      if (gVar10.isa == (gravity_class_t *)0x0) {
        free(s);
        bVar5 = false;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = aVar7.n;
        gravity_vm_setslot(vm,(gravity_value_t)(auVar4 << 0x40),rindex);
        local_78 = 1;
      }
      else {
        __src = (aVar7.p)->objclass;
        uVar6 = *(uint *)((long)&(aVar7.p)->identifier + 4);
        iVar3 = (int)__n;
        new_size = local_70;
        if (alloc - len < uVar6 + iVar3 + 1) {
          new_size = (ulong)(alloc + (uVar6 + iVar3) * 2 + 0x1000);
          s = (char *)gravity_realloc(vm,s,new_size);
          if (s == (char *)0x0) {
            local_78 = 0;
            value.field_1.n = 0;
            value.isa = gravity_class_null;
            gravity_vm_setslot(vm,value,rindex);
            bVar5 = false;
            goto LAB_0011b871;
          }
        }
        local_70 = new_size;
        memcpy(s + uVar8,__src,(ulong)uVar6);
        uVar8 = (ulong)(len + uVar6);
        s[uVar8] = '\0';
        lVar9 = lVar9 + 1;
        bVar5 = true;
        if ((lVar9 < (long)pgVar2) && (iVar3 != 0)) {
          memcpy(s + uVar8,__src_00,__n);
          uVar8 = (ulong)(len + uVar6 + iVar3);
          s[uVar8] = '\0';
        }
      }
LAB_0011b871:
    } while (bVar5);
  }
  return (_Bool)((byte)local_78 & 1);
}

Assistant:

static bool list_join (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    gravity_list_t *list = VALUE_AS_LIST(GET_VALUE(0));
    const char *sep = NULL;
    if ((nargs > 1) && VALUE_ISA_STRING(GET_VALUE(1))) sep = VALUE_AS_CSTRING(GET_VALUE(1));

    // create a new empty buffer
    uint32_t alloc = (uint32_t) (marray_size(list->array) * 64);
    if (alloc == 0) alloc = 256;
    uint32_t len = 0;
    uint32_t seplen = (sep) ? VALUE_AS_STRING(GET_VALUE(1))->len : 0;
    char *_buffer = mem_alloc(vm, alloc);
    CHECK_MEM_ALLOC(_buffer);

    register gravity_int_t n = marray_size(list->array);
    register gravity_int_t i = 0;

    // traverse list and append each item
    while (i < n) {
        gravity_value_t value = convert_value2string(vm, marray_get(list->array, i));
        if (VALUE_ISA_ERROR(value)) {
            mem_free(_buffer);
            RETURN_VALUE(value, rindex);
        }

        // compute string to append
        const char *s2 = VALUE_AS_STRING(value)->s;
        uint32_t req = VALUE_AS_STRING(value)->len;
        uint32_t free_mem = alloc - len;

        // check if buffer needs to be reallocated
        if (free_mem < req + seplen + 1) {
            uint64_t to_alloc = alloc + (req + seplen) * 2 + 4096;
            _buffer = mem_realloc(vm, _buffer, (uint32_t)to_alloc);
            if (!_buffer) {
                mem_free(_buffer);
                RETURN_ERROR_SIMPLE();
            }
            alloc = (uint32_t)to_alloc;
        }

        // copy s2 to into buffer
        memcpy(_buffer+len, s2, req);
        len += req;

        // NULL terminate the C string
        _buffer[len] = 0;
        
        // check for separator string
        if (i+1 < n && seplen) {
            memcpy(_buffer+len, sep, seplen);
            len += seplen;
            _buffer[len] = 0;
        }

        ++i;
    }

    gravity_string_t *result = gravity_string_new(vm, _buffer, len, alloc);
    RETURN_VALUE(VALUE_FROM_OBJECT(result), rindex);
}